

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# labeling_fchang_2003.h
# Opt level: O1

double __thiscall CT::Alloc(CT *this)

{
  double dVar1;
  int *piVar2;
  Mat1i *pMVar3;
  long lVar4;
  double dVar5;
  double dVar6;
  Mat local_70 [96];
  
  lVar4 = cv::getTickCount();
  (this->super_Labeling2D<(Connectivity2D)8,_false>).super_Labeling.perf_.counter_.last =
       (double)lVar4;
  piVar2 = *(int **)&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_)->field_0x40;
  cv::Mat::Mat(local_70,*piVar2,piVar2[1],4);
  cv::Mat::operator=(&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_)->super_Mat,
                     local_70);
  cv::Mat::~Mat(local_70);
  pMVar3 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_;
  memset(*(void **)&pMVar3->field_0x10,0,*(long *)&pMVar3->field_0x20 - *(long *)&pMVar3->field_0x18
        );
  lVar4 = cv::getTickCount();
  dVar5 = (double)lVar4 -
          (this->super_Labeling2D<(Connectivity2D)8,_false>).super_Labeling.perf_.counter_.last;
  (this->super_Labeling2D<(Connectivity2D)8,_false>).super_Labeling.perf_.counter_.last = dVar5;
  (this->super_Labeling2D<(Connectivity2D)8,_false>).super_Labeling.perf_.counter_.total =
       (this->super_Labeling2D<(Connectivity2D)8,_false>).super_Labeling.perf_.counter_.total +
       dVar5;
  dVar1 = (this->super_Labeling2D<(Connectivity2D)8,_false>).super_Labeling.perf_.tick_frequency_;
  lVar4 = cv::getTickCount();
  (this->super_Labeling2D<(Connectivity2D)8,_false>).super_Labeling.perf_.counter_.last =
       (double)lVar4;
  pMVar3 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_;
  memset(*(void **)&pMVar3->field_0x10,0,*(long *)&pMVar3->field_0x20 - *(long *)&pMVar3->field_0x18
        );
  lVar4 = cv::getTickCount();
  dVar6 = (double)lVar4 -
          (this->super_Labeling2D<(Connectivity2D)8,_false>).super_Labeling.perf_.counter_.last;
  (this->super_Labeling2D<(Connectivity2D)8,_false>).super_Labeling.perf_.counter_.last = dVar6;
  (this->super_Labeling2D<(Connectivity2D)8,_false>).super_Labeling.perf_.counter_.total =
       (this->super_Labeling2D<(Connectivity2D)8,_false>).super_Labeling.perf_.counter_.total +
       dVar6;
  return (dVar5 * 1000.0) / dVar1 -
         (dVar6 * 1000.0) /
         (this->super_Labeling2D<(Connectivity2D)8,_false>).super_Labeling.perf_.tick_frequency_;
}

Assistant:

double Alloc()
    {
        // Memory allocation for the output image
        perf_.start();
        img_labels_ = cv::Mat1i(img_.size());
        memset(img_labels_.data, 0, img_labels_.dataend - img_labels_.datastart);
        perf_.stop();
        double t = perf_.last();
        perf_.start();
        memset(img_labels_.data, 0, img_labels_.dataend - img_labels_.datastart);
        perf_.stop();
        double ma_t = t - perf_.last();
        // Return total time
        return ma_t;
    }